

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_MAD(Context *ctx)

{
  char local_158 [8];
  char code [128];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  Context *ctx_local;
  
  make_METAL_srcarg_string_masked(ctx,0,src1 + 0x38,0x40);
  make_METAL_srcarg_string_masked(ctx,1,src2 + 0x38,0x40);
  make_METAL_srcarg_string_masked(ctx,2,code + 0x78,0x40);
  make_METAL_destarg_assign(ctx,local_158,0x80,"(%s * %s) + %s",src1 + 0x38,src2 + 0x38,code + 0x78)
  ;
  output_line(ctx,"%s",local_158);
  return;
}

Assistant:

static void emit_METAL_MAD(Context *ctx)
{
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char src2[64]; make_METAL_srcarg_string_masked(ctx, 2, src2, sizeof (src2));
    char code[128];
    make_METAL_destarg_assign(ctx, code, sizeof (code), "(%s * %s) + %s", src0, src1, src2);
    output_line(ctx, "%s", code);
}